

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::~MapEntryImpl(MapEntryImpl<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                *this)

{
  ulong uVar1;
  Value *this_00;
  undefined8 *puVar2;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__MapEntryImpl_00486538;
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 == (undefined8 *)0x0) {
    if ((undefined8 *)(this->key_).tagged_ptr_.ptr_ != &fixed_address_empty_string_abi_cxx11_) {
      ArenaStringPtr::DestroyNoArenaSlowPath(&this->key_);
    }
    this_00 = this->value_;
    if (this_00 != (Value *)0x0) {
      CoreML::Specification::MILSpec::Value::~Value(this_00);
    }
    operator_delete(this_00,0x30);
  }
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__MessageLite_004915d0;
  InternalMetadata::~InternalMetadata(&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

~MapEntryImpl() {
    if (Base::GetArenaForAllocation() != nullptr) return;
    KeyTypeHandler::DeleteNoArena(key_);
    ValueTypeHandler::DeleteNoArena(value_);
  }